

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddLanguageFlags(cmLocalGenerator *this,string *flags,string *lang,string *config)

{
  string flagsVar;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"CMAKE_",&local_49);
  std::__cxx11::string::append((string *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  AddConfigVariableFlags(this,flags,&local_48,config);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);
}